

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider
          (DefaultThreadPoolProvider *this,int count)

{
  (this->super_ThreadPoolProvider)._vptr_ThreadPoolProvider =
       (_func_int **)&PTR__DefaultThreadPoolProvider_003e21e8;
  Semaphore::Semaphore(&(this->_data).taskSemaphore,0);
  (this->_data).tasks.
  super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).tasks.
  super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_data).taskMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_data).tasks.
  super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_data).taskMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_data).taskMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_data).taskMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_data).taskMutex.super___mutex_base._M_mutex + 8) = 0;
  Semaphore::Semaphore(&(this->_data).threadSemaphore,0);
  (this->_data).threads.
  super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).threads.
  super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_data).threadMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_data).threads.
  super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_data).threadMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_data).threadMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_data).threadMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_data).threadMutex.super___mutex_base._M_mutex + 8) = 0;
  (*(this->super_ThreadPoolProvider)._vptr_ThreadPoolProvider[3])(this,count);
  return;
}

Assistant:

DefaultThreadPoolProvider::DefaultThreadPoolProvider (int count)
{
    setNumThreads(count);
}